

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

int __thiscall HevcSpsUnit::vui_parameters(HevcSpsUnit *this)

{
  bool bVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  bool aspect_ratio_info_present_flag;
  HevcSpsUnit *this_local;
  
  bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  if ((bVar1) &&
     (uVar3 = BitStreamReader::getBits(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,8)
     , uVar3 == 0xff)) {
    BitStreamReader::skipBits(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,0x20);
  }
  bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  if (bVar1) {
    BitStreamReader::skipBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  }
  bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  if (bVar1) {
    BitStreamReader::skipBits(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,4);
    bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
    if (bVar1) {
      uVar2 = BitStreamReader::getBits<unsigned_char>
                        (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,8);
      this->colour_primaries = uVar2;
      uVar2 = BitStreamReader::getBits<unsigned_char>
                        (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,8);
      this->transfer_characteristics = uVar2;
      uVar2 = BitStreamReader::getBits<unsigned_char>
                        (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,8);
      this->matrix_coeffs = uVar2;
    }
  }
  bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  if (bVar1) {
    uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    this->chroma_sample_loc_type_top_field = uVar3;
    if (5 < this->chroma_sample_loc_type_top_field) {
      return 1;
    }
    uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    this->chroma_sample_loc_type_bottom_field = uVar3;
    if (5 < this->chroma_sample_loc_type_bottom_field) {
      return 1;
    }
  }
  BitStreamReader::skipBits(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,3);
  bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  if (bVar1) {
    HevcUnit::extractUEGolombCode((HevcUnit *)this);
    HevcUnit::extractUEGolombCode((HevcUnit *)this);
    HevcUnit::extractUEGolombCode((HevcUnit *)this);
    HevcUnit::extractUEGolombCode((HevcUnit *)this);
  }
  bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  if (bVar1) {
    uVar3 = BitStreamReader::getBits
                      (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,0x20);
    this->num_units_in_tick = uVar3;
    uVar3 = BitStreamReader::getBits
                      (&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,0x20);
    this->time_scale = uVar3;
    bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
    if ((bVar1) && (uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this), uVar3 == 0xffffffff)) {
      return 1;
    }
    bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
    if ((bVar1) &&
       (iVar4 = hrd_parameters(this,true,(byte)(this->super_HevcUnitWithProfile).field_0x3c - 1),
       iVar4 != 0)) {
      return 1;
    }
  }
  bVar1 = BitStreamReader::getBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
  if (bVar1) {
    BitStreamReader::skipBits(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader,3);
    uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    if (0xfff < uVar3) {
      return 1;
    }
    uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    if (0x10 < uVar3) {
      return 1;
    }
    uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    if (0x10 < uVar3) {
      return 1;
    }
    uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    if (0xf < uVar3) {
      return 1;
    }
    uVar3 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    if (0xf < uVar3) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int HevcSpsUnit::vui_parameters()
{
    const bool aspect_ratio_info_present_flag = m_reader.getBit();
    if (aspect_ratio_info_present_flag)
    {
        if (m_reader.getBits(8) == EXTENDED_SAR)  // aspect_ratio_idc
            m_reader.skipBits(32);                // sar_width, sar_height
    }

    if (m_reader.getBit())   // overscan_info_present_flag
        m_reader.skipBit();  // overscan_appropriate_flag u(1)
    if (m_reader.getBit())   // video_signal_type_present_flag
    {
        m_reader.skipBits(4);   // video_format, video_full_range_flag
        if (m_reader.getBit())  // colour_description_present_flag
        {
            colour_primaries = m_reader.getBits<uint8_t>(8);
            transfer_characteristics = m_reader.getBits<uint8_t>(8);
            matrix_coeffs = m_reader.getBits<uint8_t>(8);
        }
    }

    if (m_reader.getBit())  // chroma_loc_info_present_flag
    {
        chroma_sample_loc_type_top_field = extractUEGolombCode();
        if (chroma_sample_loc_type_top_field > 5)
            return 1;
        chroma_sample_loc_type_bottom_field = extractUEGolombCode();
        if (chroma_sample_loc_type_bottom_field > 5)
            return 1;
    }

    m_reader.skipBits(3);  // unused flags

    if (m_reader.getBit())  // default_display_window_flag
    {
        extractUEGolombCode();  // def_disp_win_left_offset ue(v)
        extractUEGolombCode();  // def_disp_win_right_offset ue(v)
        extractUEGolombCode();  // def_disp_win_top_offset ue(v)
        extractUEGolombCode();  // def_disp_win_bottom_offset ue(v)
    }

    if (m_reader.getBit())  // vui_timing_info_present_flag
    {
        num_units_in_tick = m_reader.getBits(32);
        time_scale = m_reader.getBits(32);

        if (m_reader.getBit())  // vui_poc_proportional_to_timing_flag
        {
            if (extractUEGolombCode() == UINT_MAX)  // vui_num_ticks_poc_diff_one_minus1
                return 1;
        }
        if (m_reader.getBit())  // vui_hrd_parameters_present_flag
        {
            if (hrd_parameters(true, max_sub_layers - 1) != 0)
                return 1;
        }
    }
    if (m_reader.getBit())  // bitstream_restriction_flag
    {
        m_reader.skipBits(3);  //  unused flags

        if (extractUEGolombCode() > 4095)  // min_spatial_segmentation_idc
            return 1;
        if (extractUEGolombCode() > 16)  // max_bytes_per_pic_denom
            return 1;
        if (extractUEGolombCode() > 16)  // max_bits_per_min_cu_denom
            return 1;
        if (extractUEGolombCode() > 15)  // log2_max_mv_length_horizontal
            return 1;
        if (extractUEGolombCode() > 15)  // log2_max_mv_length_vertical
            return 1;
    }
    return 0;
}